

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O1

void __thiscall unitStrings_squared_Test::TestBody(unitStrings_squared_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unit_data uVar2;
  precise_unit *ppVar3;
  uint64_t in_RCX;
  string *psVar4;
  string *__return_storage_ptr__;
  char *pcVar5;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  AssertionResult gtest_ar;
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  string local_58;
  AssertHelper local_38;
  unit_data local_30;
  undefined4 local_2c;
  float local_24;
  undefined8 local_20;
  
  local_24 = units::detail::power_const<float>(0.3048,2);
  units::detail::unit_data::pow
            ((unit_data *)((long)&units::ft + 4),(double)CONCAT44(extraout_XMM0_Db,local_24),
             in_XMM1_Qa);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_38.data_ = (AssertHelperData *)(double)local_24;
  local_2c = 0;
  psVar4 = &local_58;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_38,ppVar3,in_RCX);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            (local_68,"to_string(ft.pow(2))","\"ft^2\"",psVar4,(char (*) [5])"ft^2");
  paVar1 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_60->_M_dataplus)._M_p;
    }
    psVar4 = (string *)0x39;
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x39,pcVar5);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)((long)&units::N + 4),(unit_data *)((long)&units::N + 4));
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_38.data_ = (AssertHelperData *)&DAT_3ff0000000000000;
  local_2c = 0;
  local_30 = uVar2;
  units::to_string_abi_cxx11_(&local_58,(units *)&local_38,ppVar3,(uint64_t)psVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_68,"to_string(N * N)","\"N^2\"",&local_58,(char (*) [4])"N^2");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)((long)&units::mm + 4),(unit_data *)((long)&units::mm + 4));
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_38.data_ = (AssertHelperData *)0x3eb0c6f7c0000000;
  local_2c = 0;
  psVar4 = &local_58;
  local_30 = uVar2;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_38,ppVar3,0x3eb0c6f7c0000000);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            (local_68,"to_string(mm * mm)","\"mm^2\"",psVar4,(char (*) [5])0x1fb7a6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_60->_M_dataplus)._M_p;
    }
    psVar4 = (string *)0x3b;
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)((long)&units::mm + 4),(unit_data *)((long)&units::mm + 4));
  local_20 = (ulong)(uint)uVar2 << 0x20 | 0x358637be;
  local_24 = 999999.9;
  uVar2 = units::detail::unit_data::inv((unit_data *)((long)&local_20 + 4));
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_38.data_ = (AssertHelperData *)(double)local_24;
  local_2c = 0;
  __return_storage_ptr__ = &local_58;
  local_30 = uVar2;
  units::to_string_abi_cxx11_(__return_storage_ptr__,(units *)&local_38,ppVar3,(uint64_t)psVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[7]>
            (local_68,"to_string((mm * mm).inv())","\"1/mm^2\"",__return_storage_ptr__,
             (char (*) [7])"1/mm^2");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_60->_M_dataplus)._M_p;
    }
    __return_storage_ptr__ = (string *)0x3c;
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)((long)&units::Hz + 4),(unit_data *)((long)&units::Hz + 4));
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_38.data_ = (AssertHelperData *)&DAT_3ff0000000000000;
  local_2c = 0;
  local_30 = uVar2;
  units::to_string_abi_cxx11_(&local_58,(units *)&local_38,ppVar3,(uint64_t)__return_storage_ptr__);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            (local_68,"to_string(Hz * Hz)","\"Hz^2\"",&local_58,(char (*) [5])"Hz^2");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  return;
}

Assistant:

TEST(unitStrings, squared)
{
    EXPECT_EQ(to_string(ft.pow(2)), "ft^2");
    EXPECT_EQ(to_string(N * N), "N^2");
    EXPECT_EQ(to_string(mm * mm), "mm^2");
    EXPECT_EQ(to_string((mm * mm).inv()), "1/mm^2");
    EXPECT_EQ(to_string(Hz * Hz), "Hz^2");
}